

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O2

void __thiscall
GOESNImageHandler::GOESNImageHandler
          (GOESNImageHandler *this,Handler *config,shared_ptr<FileWriter> *fileWriter)

{
  string *__lhs;
  pointer pbVar1;
  bool bVar2;
  runtime_error *this_00;
  uint16_t uVar3;
  int *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *region;
  pointer pbVar4;
  char local_54 [4];
  string local_50;
  
  (this->super_Handler)._vptr_Handler = (_func_int **)&PTR_handle_001f40a0;
  Config::Handler::Handler(&this->config_,config);
  std::__shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>,
             &fileWriter->super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>);
  *(_Manager_type *)
   ((long)&(this->segments_)._M_h.
           super__Hashtable_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           .
           super__Hash_code_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           .super__Hashtable_ebo_helper<1,_SegmentKeyHash,_false>._M_tp.
           super_function<unsigned_long_(std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)>
   + 0x10) = (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)&(this->segments_)._M_h.
           super__Hashtable_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           .
           super__Hash_code_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           .super__Hashtable_ebo_helper<1,_SegmentKeyHash,_false>._M_tp.
           super_function<unsigned_long_(std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)>
   + 0x18) = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->segments_)._M_h.
    super__Hashtable_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    .
    super__Hash_code_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
    .super__Hashtable_ebo_helper<1,_SegmentKeyHash,_false>._M_tp.
    super_function<unsigned_long_(std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)>
    .super__Function_base = 0;
  *(undefined8 *)
   ((long)&(this->segments_)._M_h.
           super__Hashtable_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           .
           super__Hash_code_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::__detail::_Select1st,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           .super__Hashtable_ebo_helper<1,_SegmentKeyHash,_false>._M_tp.
           super_function<unsigned_long_(std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)>
   + 8) = 0;
  (this->segments_)._M_h._M_buckets = &(this->segments_)._M_h._M_single_bucket;
  (this->segments_)._M_h._M_bucket_count = 1;
  (this->segments_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->segments_)._M_h._M_element_count = 0;
  (this->segments_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->segments_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->segments_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pbVar1 = (this->config_).regions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->config_).regions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    util::toUpper(&local_50,pbVar4);
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pbVar1 = (this->config_).channels.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->config_).channels.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    util::toUpper(&local_50,pbVar4);
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __lhs = &(this->config_).origin;
  bVar2 = std::operator==(__lhs,"goes13");
  uVar3 = 0xd;
  if (!bVar2) {
    bVar2 = std::operator==(__lhs,"goes15");
    uVar3 = 0xf;
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_54[0] = 'E';
      local_54[1] = '\0';
      local_54[2] = '\0';
      local_54[3] = '\0';
      util::str<char[29],char[100],char[2],int>
                (&local_50,(util *)"Assertion `false` failed at ",
                 (char (*) [29])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/handler_goesn.cc"
                 ,(char (*) [100])0x1c0c61,(char (*) [2])local_54,in_R9);
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this->productID_ = uVar3;
  return;
}

Assistant:

GOESNImageHandler::GOESNImageHandler(
  const Config::Handler& config,
  const std::shared_ptr<FileWriter>& fileWriter)
  : config_(config),
    fileWriter_(fileWriter) {
  for (auto& region : config_.regions) {
    region = toUpper(region);
  }
  for (auto& channel : config_.channels) {
    channel = toUpper(channel);
  }

  if (config_.origin == "goes13") {
    productID_ = 13;
  } else if (config_.origin == "goes15") {
    productID_ = 15;
  } else {
    ASSERT(false);
  }
}